

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.c
# Opt level: O2

void png_write(char *filename,image_t *image)

{
  uint uVar1;
  char *pcVar2;
  FILE *__stream;
  int color_type;
  FILE *__stream_00;
  png_structp png_ptr_00;
  png_infop info_ptr_00;
  png_bytepp image_00;
  int *piVar3;
  char *pcVar4;
  uint y;
  ulong uVar5;
  bool bVar6;
  png_infop info_ptr;
  png_structp png_ptr;
  
  __stream_00 = fopen(filename,"wb");
  __stream = _stderr;
  pcVar2 = argv0;
  if (__stream_00 != (FILE *)0x0) {
    uVar5 = 0;
    bVar6 = image->format != FORMAT_GRAY8;
    color_type = 6;
    if (!bVar6) {
      color_type = 0;
    }
    png_ptr_00 = png_create_write_struct
                           ("1.6.44",(png_voidp)0x0,(png_error_ptr)0x0,(png_error_ptr)0x0);
    png_ptr = png_ptr_00;
    png_set_compression_level(png_ptr_00,1);
    info_ptr_00 = png_create_info_struct(png_ptr_00);
    info_ptr = info_ptr_00;
    png_init_io(png_ptr_00,(png_FILE_p)__stream_00);
    png_set_IHDR(png_ptr_00,info_ptr_00,image->width,image->height,8,color_type,0,0,0);
    png_write_info(png_ptr_00,info_ptr_00);
    uVar1 = image->height;
    image_00 = (png_bytepp)malloc((ulong)uVar1 * 8);
    for (; uVar1 != uVar5; uVar5 = uVar5 + 1) {
      image_00[uVar5] = image->data + (image->width * (int)uVar5 << bVar6 * '\x02');
    }
    png_write_image(png_ptr_00,image_00);
    free(image_00);
    png_write_end(png_ptr_00,info_ptr_00);
    png_destroy_write_struct(&png_ptr,&info_ptr);
    fclose(__stream_00);
    return;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  fprintf(__stream,"%s: couldn\'t open %s for writing: %s\n",pcVar2,filename,pcVar4);
  return;
}

Assistant:

void
png_write(
    const char* filename,
    image_t* image)
{
    FILE* stream;
    png_structp png_ptr;
    png_infop info_ptr;
    png_bytepp imagep;

    int bit_depth;
    int color_type;
    int bytes_per_pixel;

    stream = fopen(filename, "wb");
    if(!stream) {
        fprintf(stderr, "%s: couldn't open %s for writing: %s\n",
            argv0, filename, strerror(errno));
        return;
    }

    if (image->format == FORMAT_GRAY8) {
        bit_depth = 8;
        color_type = PNG_COLOR_TYPE_GRAY;
        bytes_per_pixel = 1;
    } else /* if (image->format == FORMAT_RGBA8888) */ {
        bit_depth = 8;
        color_type = PNG_COLOR_TYPE_RGB_ALPHA;
        bytes_per_pixel = 4;
    } /* else { abort(); } */

    png_ptr = png_create_write_struct(PNG_LIBPNG_VER_STRING, NULL, NULL, NULL);
    png_set_compression_level(png_ptr, 1);
    info_ptr = png_create_info_struct(png_ptr);
    png_init_io(png_ptr, stream);

    png_set_IHDR(png_ptr, info_ptr,
        image->width, image->height, bit_depth, color_type,
        PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT, PNG_FILTER_TYPE_DEFAULT);

    png_write_info(png_ptr, info_ptr);

    imagep = malloc(image->height * sizeof(png_byte*));
    for (unsigned int y = 0; y < image->height; ++y)
        imagep[y] = (png_byte*)(image->data + y * image->width * bytes_per_pixel);

    png_write_image(png_ptr, imagep);
    free(imagep);
    png_write_end(png_ptr, info_ptr);
    png_destroy_write_struct(&png_ptr, &info_ptr);

    fclose(stream);
}